

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Extractor::input(Extractor *this,char *blob_name,Mat *in)

{
  int iVar1;
  undefined8 in_RAX;
  int local_14;
  
  iVar1 = Net::find_blob_index_by_name(this->d->net,blob_name);
  if (iVar1 != -1) {
    iVar1 = input(this,iVar1,in);
    return iVar1;
  }
  input();
  local_14 = (int)((ulong)in_RAX >> 0x20);
  return local_14;
}

Assistant:

int Extractor::input(const char* blob_name, const Mat& in)
{
    int blob_index = d->net->find_blob_index_by_name(blob_name);
    if (blob_index == -1)
    {
        NCNN_LOGE("Try");
        const std::vector<const char*>& input_names = d->net->input_names();
        for (size_t i = 0; i < input_names.size(); i++)
        {
            NCNN_LOGE("    ex.input(\"%s\", in%d);", input_names[i], (int)i);
        }

        return -1;
    }

    return input(blob_index, in);
}